

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_retry_aead(void)

{
  uint uVar1;
  size_t sVar2;
  ptls_aead_context_t *retry_aead_00;
  ptls_aead_context_t *retry_aead;
  size_t decoded_len;
  size_t off;
  quicly_decoded_packet_t decoded;
  uint8_t packet_bytes [36];
  quicly_cid_t odcid;
  long lVar3;
  quicly_context_t *in_stack_ffffffffffffff30;
  undefined1 local_48 [48];
  undefined3 uVar4;
  undefined4 uVar5;
  uint8_t uVar6;
  
  uVar4._0_1_ = '\0';
  uVar4._1_1_ = '\0';
  uVar4._2_1_ = '\0';
  uVar5._0_1_ = '\0';
  uVar5._1_1_ = '\0';
  uVar5._2_1_ = '\0';
  uVar5._3_1_ = '\0';
  uVar6 = '\b';
  memcpy(local_48,&DAT_00164ca0,0x24);
  lVar3 = 0;
  sVar2 = quicly_decode_packet
                    ((quicly_context_t *)decoded.octets.base,(quicly_decoded_packet_t *)off,
                     (uint8_t *)decoded_len,(size_t)retry_aead,
                     (size_t *)CONCAT17(uVar6,CONCAT43(uVar5,uVar4)));
  _ok((int)(ulong)(sVar2 == 0x24),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x10c)
  ;
  _ok((int)(ulong)(lVar3 == 0x24),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x10d)
  ;
  retry_aead_00 =
       create_retry_aead(in_stack_ffffffffffffff30,(uint32_t)((ulong)lVar3 >> 0x20),(int)lVar3);
  uVar1 = validate_retry_tag((quicly_decoded_packet_t *)&stack0xffffffffffffff30,
                             (quicly_cid_t *)&stack0xffffffffffffffeb,retry_aead_00);
  _ok((int)(ulong)uVar1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/test.c",0x111)
  ;
  ptls_aead_free((ptls_aead_context_t *)0x14f99b);
  return;
}

Assistant:

static void test_retry_aead(void)
{
    quicly_cid_t odcid = {{0x83, 0x94, 0xc8, 0xf0, 0x3e, 0x51, 0x57, 0x08}, 8};
    uint8_t packet_bytes[] = {0xff, 0xff, 0x00, 0x00, 0x1d, 0x00, 0x08, 0xf0, 0x67, 0xa5, 0x50, 0x2a,
                              0x42, 0x62, 0xb5, 0x74, 0x6f, 0x6b, 0x65, 0x6e, 0xd1, 0x69, 0x26, 0xd8,
                              0x1f, 0x6f, 0x9c, 0xa2, 0x95, 0x3a, 0x8a, 0xa4, 0x57, 0x5e, 0x1e, 0x49};

    /* decode (see `test_vector` for the rationale of overwriting the version) */
    quicly_decoded_packet_t decoded;
    size_t off = 0, decoded_len = quicly_decode_packet(&quic_ctx, &decoded, packet_bytes, sizeof(packet_bytes), &off);
    ok(decoded_len == sizeof(packet_bytes));
    ok(off == sizeof(packet_bytes));

    /* decrypt */
    ptls_aead_context_t *retry_aead = create_retry_aead(&quic_ctx, QUICLY_PROTOCOL_VERSION_CURRENT, 0);
    ok(validate_retry_tag(&decoded, &odcid, retry_aead));
    ptls_aead_free(retry_aead);
}